

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  Compress CVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmCPackComponent *pcVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  undefined7 in_register_00000031;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar11;
  char *local_600 [4];
  cmCPackComponent *local_5e0;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  string localToplevel;
  __node_base_ptr p_Stack_3f0;
  __node_base_ptr *local_3e8;
  size_type local_3e0;
  __node_base local_3d8;
  size_type sStack_3d0;
  float local_3c8;
  size_t local_3c0;
  __node_base_ptr p_Stack_3b8;
  __node_base_ptr *local_3b0;
  size_type local_3a8;
  __node_base local_3a0;
  size_type sStack_398;
  float local_390;
  size_t local_388;
  __node_base_ptr p_Stack_380;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    psVar6 = &(this->super_cmCPackGenerator).toplevel;
    pcVar7 = (cmCPackComponent *)
             (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    while (pcVar7 != (cmCPackComponent *)
                     &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                      super__Rb_tree_header) {
      local_5e0 = pcVar7;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
      poVar10 = std::operator<<((ostream *)&gf,"Packaging component group: ");
      psVar8 = &local_5e0->DisplayName;
      poVar10 = std::operator<<(poVar10,(string *)psVar8);
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar3,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x14a,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,"/");
      GetArchiveComponentFileName((string *)&archive,this,psVar8,true);
      std::operator+(&packageFileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&archive);
      std::__cxx11::string::~string((string *)&archive);
      std::__cxx11::string::~string((string *)&gf);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      localToplevel._M_dataplus._M_p = (pointer)&p_Stack_3f0;
      localToplevel._M_string_length = 1;
      localToplevel.field_2._M_allocated_capacity = 0;
      localToplevel.field_2._8_8_ = 0;
      p_Stack_3f0 = (__node_base_ptr)0x0;
      local_3e8 = &p_Stack_3b8;
      local_3e0 = 1;
      local_3d8._M_nxt = (_Hash_node_base *)0x0;
      sStack_3d0 = 0;
      local_3c8 = 1.0;
      local_3c0 = 0;
      p_Stack_3b8 = (__node_base_ptr)0x0;
      local_3b0 = &p_Stack_380;
      local_3a8 = 1;
      local_3a0._M_nxt = (_Hash_node_base *)0x0;
      sStack_398 = 0;
      local_390 = 1.0;
      local_388 = 0;
      p_Stack_380 = (__node_base_ptr)0x0;
      cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
      cmGeneratedFileStream::Open(&gf,&packageFileName,false,true);
      iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gf);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,
                                  "Problem to generate Header for archive <");
        poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
        poVar10 = std::operator<<(poVar10,">.");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x154,(char *)archive.Stream);
        std::__cxx11::string::~string((string *)&archive);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_001b9010:
        cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
        Deduplicator::~Deduplicator((Deduplicator *)&localToplevel);
        psVar6 = &packageFileName;
        goto LAB_001b902f;
      }
      CVar1 = this->Compress;
      iVar5 = GetThreadCount(this);
      cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,CVar1,&this->ArchiveFormat,0,iVar5);
      bVar4 = cmArchiveWrite::Open(&archive);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to open archive <");
        poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
        poVar10 = std::operator<<(poVar10,">, ERROR = ");
        std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
        poVar10 = std::operator<<(poVar10,(string *)local_600);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::string::~string((string *)local_600);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x154,local_600[0]);
LAB_001b8fef:
        std::__cxx11::string::~string((string *)local_600);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        cmArchiveWrite::~cmArchiveWrite(&archive);
        goto LAB_001b9010;
      }
      if (archive.Error._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
        poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
        poVar10 = std::operator<<(poVar10,">, ERROR = ");
        std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
        poVar10 = std::operator<<(poVar10,(string *)local_600);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::string::~string((string *)local_600);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x154,local_600[0]);
        goto LAB_001b8fef;
      }
      pcVar2 = (pointer)(local_5e0->Plist)._M_string_length;
      for (pcVar11 = (local_5e0->Plist)._M_dataplus._M_p; pcVar11 != pcVar2; pcVar11 = pcVar11 + 8)
      {
        addOneComponentToArchive
                  (this,&archive,*(cmCPackComponent **)pcVar11,(Deduplicator *)&localToplevel);
      }
      cmArchiveWrite::~cmArchiveWrite(&archive);
      cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &packageFileName);
      Deduplicator::~Deduplicator((Deduplicator *)&localToplevel);
      std::__cxx11::string::~string((string *)&packageFileName);
      pcVar7 = (cmCPackComponent *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_5e0);
    }
    for (p_Var9 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      if (*(long *)(p_Var9 + 4) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
        poVar10 = std::operator<<((ostream *)&gf,"Component <");
        local_5e0 = (cmCPackComponent *)(p_Var9 + 2);
        poVar10 = std::operator<<(poVar10,(string *)local_5e0);
        poVar10 = std::operator<<(poVar10,"> does not belong to any group, package it separately.");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x167,_cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gf,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&cmCPackLog_msg);
        psVar8 = (string *)
                 cmCPackGenerator::GetOption
                           (&this->super_cmCPackGenerator,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf
                           );
        if (psVar8 == (string *)0x0) {
          psVar8 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&localToplevel,(string *)psVar8);
        std::__cxx11::string::~string((string *)&gf);
        std::__cxx11::string::string((string *)&packageFileName,(string *)psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 1));
        std::__cxx11::string::append((string *)&localToplevel);
        std::__cxx11::string::~string((string *)&gf);
        GetArchiveComponentFileName((string *)&cmCPackLog_msg,this,(string *)(p_Var9 + 1),false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                       (string *)&cmCPackLog_msg);
        std::__cxx11::string::append((string *)&packageFileName);
        std::__cxx11::string::~string((string *)&gf);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
        cmGeneratedFileStream::Open(&gf,&packageFileName,false,true);
        iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&gf);
        if (iVar5 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,
                                    "Problem to generate Header for archive <");
          poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
          poVar10 = std::operator<<(poVar10,">.");
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x171,(char *)archive.Stream);
          goto LAB_001b8c7d;
        }
        CVar1 = this->Compress;
        iVar5 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,CVar1,&this->ArchiveFormat,0,iVar5);
        bVar4 = cmArchiveWrite::Open(&archive);
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to open archive <");
          poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
          poVar10 = std::operator<<(poVar10,">, ERROR = ");
          std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
          poVar10 = std::operator<<(poVar10,(string *)local_600);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::string::~string((string *)local_600);
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x171,local_600[0]);
          goto LAB_001b8f0d;
        }
        if (archive.Error._M_string_length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
          poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
          poVar10 = std::operator<<(poVar10,">, ERROR = ");
          std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
          poVar10 = std::operator<<(poVar10,(string *)local_600);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::string::~string((string *)local_600);
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x171,local_600[0]);
          goto LAB_001b8f0d;
        }
        addOneComponentToArchive(this,&archive,local_5e0,(Deduplicator *)0x0);
        cmArchiveWrite::~cmArchiveWrite(&archive);
        cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &packageFileName);
        std::__cxx11::string::~string((string *)&packageFileName);
        std::__cxx11::string::~string((string *)&localToplevel);
      }
    }
LAB_001b8bfe:
    iVar5 = 1;
  }
  else {
    pcVar7 = (cmCPackComponent *)
             (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    local_5e0 = (cmCPackComponent *)
                &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
LAB_001b8549:
    if (pcVar7 == local_5e0) goto LAB_001b8bfe;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gf,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&cmCPackLog_msg);
    psVar6 = (string *)
             cmCPackGenerator::GetOption
                       (&this->super_cmCPackGenerator,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf);
    if (psVar6 == (string *)0x0) {
      psVar6 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&localToplevel,(string *)psVar6);
    std::__cxx11::string::~string((string *)&gf);
    std::__cxx11::string::string
              ((string *)&packageFileName,(string *)&(this->super_cmCPackGenerator).toplevel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                   &pcVar7->DisplayName);
    std::__cxx11::string::append((string *)&localToplevel);
    std::__cxx11::string::~string((string *)&gf);
    GetArchiveComponentFileName((string *)&cmCPackLog_msg,this,&pcVar7->DisplayName,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                   (string *)&cmCPackLog_msg);
    std::__cxx11::string::append((string *)&packageFileName);
    std::__cxx11::string::~string((string *)&gf);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
    cmGeneratedFileStream::Open(&gf,&packageFileName,false,true);
    iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf
                      );
    if (iVar5 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,
                                "Problem to generate Header for archive <");
      poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
      poVar10 = std::operator<<(poVar10,">.");
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x186,(char *)archive.Stream);
LAB_001b8c7d:
      std::__cxx11::string::~string((string *)&archive);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      goto LAB_001b8f2e;
    }
    CVar1 = this->Compress;
    iVar5 = GetThreadCount(this);
    cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,CVar1,&this->ArchiveFormat,0,iVar5);
    bVar4 = cmArchiveWrite::Open(&archive);
    if (bVar4) {
      if (archive.Error._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
        poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
        poVar10 = std::operator<<(poVar10,">, ERROR = ");
        std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
        poVar10 = std::operator<<(poVar10,(string *)local_600);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::string::~string((string *)local_600);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x186,local_600[0]);
        goto LAB_001b8f0d;
      }
      addOneComponentToArchive(this,&archive,(cmCPackComponent *)&pcVar7->Group,(Deduplicator *)0x0)
      ;
      cmArchiveWrite::~cmArchiveWrite(&archive);
      cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &packageFileName);
      std::__cxx11::string::~string((string *)&packageFileName);
      std::__cxx11::string::~string((string *)&localToplevel);
      pcVar7 = (cmCPackComponent *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar7);
      goto LAB_001b8549;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to open archive <");
    poVar10 = std::operator<<(poVar10,(string *)&packageFileName);
    poVar10 = std::operator<<(poVar10,">, ERROR = ");
    std::__cxx11::string::string((string *)local_600,(string *)&archive.Error);
    poVar10 = std::operator<<(poVar10,(string *)local_600);
    std::endl<char,std::char_traits<char>>(poVar10);
    std::__cxx11::string::~string((string *)local_600);
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x186,local_600[0]);
LAB_001b8f0d:
    std::__cxx11::string::~string((string *)local_600);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmArchiveWrite::~cmArchiveWrite(&archive);
LAB_001b8f2e:
    cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
    std::__cxx11::string::~string((string *)&packageFileName);
    psVar6 = &localToplevel;
LAB_001b902f:
    std::__cxx11::string::~string((string *)psVar6);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  this->packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(this->toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      Deduplicator deduplicator;

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, comp, &deduplicator);
        }
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(this->toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, &(comp.second), nullptr);
        }
        // add the generated package to package file names list
        this->packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(this->toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        this->addOneComponentToArchive(archive, &(comp.second), nullptr);
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}